

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServer.cpp
# Opt level: O0

bool __thiscall
FIX::SocketServer::block(SocketServer *this,Strategy *strategy,bool poll,double timeout)

{
  bool bVar1;
  reference __x;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar2;
  set<int,_std::less<int>,_std::allocator<int>_> local_118;
  undefined1 local_e8 [8];
  ServerWrapper wrapper;
  value_type *socketWithInfo;
  iterator __end1;
  iterator __begin1;
  SocketToInfo *__range1;
  set<int,_std::less<int>,_std::allocator<int>_> sockets;
  double timeout_local;
  bool poll_local;
  Strategy *strategy_local;
  SocketServer *this_local;
  
  sockets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)timeout;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
  __end1 = std::
           map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
           ::begin(&this->m_socketToInfo);
  socketWithInfo =
       (value_type *)
       std::
       map<int,_FIX::SocketInfo,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
       ::end(&this->m_socketToInfo);
  do {
    bVar1 = std::operator!=(&__end1,(_Self *)&socketWithInfo);
    if (!bVar1) {
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                (&local_118,(set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
      ServerWrapper::ServerWrapper((ServerWrapper *)local_e8,&local_118,this,strategy);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_118);
      SocketMonitor::block
                (&this->m_monitor,(Strategy *)local_e8,poll,
                 (double)sockets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      this_local._7_1_ = true;
      ServerWrapper::~ServerWrapper((ServerWrapper *)local_e8);
LAB_002c672e:
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1);
      return this_local._7_1_;
    }
    __x = std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketInfo>_>::operator*(&__end1);
    bVar1 = socket_isValid(__x->first);
    if (!bVar1) {
      this_local._7_1_ = false;
      goto LAB_002c672e;
    }
    pVar2 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)&__range1,&__x->first);
    wrapper.m_strategy = (Strategy *)pVar2.first._M_node;
    std::_Rb_tree_iterator<std::pair<const_int,_FIX::SocketInfo>_>::operator++(&__end1);
  } while( true );
}

Assistant:

bool SocketServer::block(Strategy &strategy, bool poll, double timeout) {
  std::set<socket_handle> sockets;
  for (const SocketToInfo::value_type &socketWithInfo : m_socketToInfo) {
    if (!socket_isValid(socketWithInfo.first)) {
      return false;
    }
    sockets.insert(socketWithInfo.first);
  }

  ServerWrapper wrapper(sockets, *this, strategy);
  m_monitor.block(wrapper, poll, timeout);
  return true;
}